

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O0

void __thiscall cmRealDirectoryWatcher::StartWatching(cmRealDirectoryWatcher *this)

{
  uv_fs_event_t *puVar1;
  uv_loop_t *loop;
  char *path;
  string local_30 [32];
  cmRealDirectoryWatcher *local_10;
  cmRealDirectoryWatcher *this_local;
  
  local_10 = this;
  if (this->Handle == (uv_fs_event_t *)0x0) {
    puVar1 = (uv_fs_event_t *)operator_new(0x88);
    this->Handle = puVar1;
    loop = Loop(this);
    uv_fs_event_init(loop,this->Handle);
    this->Handle->data = this;
    puVar1 = this->Handle;
    (*(this->super_cmVirtualDirectoryWatcher).super_cmIBaseWatcher._vptr_cmIBaseWatcher[3])();
    path = (char *)std::__cxx11::string::c_str();
    uv_fs_event_start(puVar1,anon_unknown.dwarf_c2dfe5::on_directory_change,path,0);
    std::__cxx11::string::~string(local_30);
  }
  cmVirtualDirectoryWatcher::StartWatching(&this->super_cmVirtualDirectoryWatcher);
  return;
}

Assistant:

void StartWatching() final
  {
    if (!this->Handle) {
      this->Handle = new uv_fs_event_t;

      uv_fs_event_init(this->Loop(), this->Handle);
      this->Handle->data = this;
      uv_fs_event_start(this->Handle, &on_directory_change, Path().c_str(), 0);
    }
    cmVirtualDirectoryWatcher::StartWatching();
  }